

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlrelationaltablemodel.cpp
# Opt level: O0

void __thiscall QSqlRelationalTableModelPrivate::clearChanges(QSqlRelationalTableModelPrivate *this)

{
  bool bVar1;
  QRelation *this_00;
  iterator o;
  long in_RDI;
  long in_FS_OFFSET;
  QSharedPointer<QRelation> *rel;
  QList<QSharedPointer<QRelation>_> *__range1;
  iterator __end1;
  iterator __begin1;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QRelation *)(in_RDI + 0x2e8);
  local_10.i = (QSharedPointer<QRelation> *)0xaaaaaaaaaaaaaaaa;
  local_10 = QList<QSharedPointer<QRelation>_>::begin((QList<QSharedPointer<QRelation>_> *)this_00);
  o = QList<QSharedPointer<QRelation>_>::end((QList<QSharedPointer<QRelation>_> *)this_00);
  while( true ) {
    bVar1 = QList<QSharedPointer<QRelation>_>::iterator::operator!=(&local_10,o);
    if (!bVar1) break;
    QList<QSharedPointer<QRelation>_>::iterator::operator*(&local_10);
    QSharedPointer<QRelation>::operator->((QSharedPointer<QRelation> *)0x1592e4);
    QRelation::clear(this_00);
    QList<QSharedPointer<QRelation>_>::iterator::operator++(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSqlRelationalTableModelPrivate::clearChanges()
{
    for (auto &rel : relations)
        rel->clear();
}